

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::createRowwisePartitioned
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,int8_t *in_partition)

{
  int iVar1;
  value_type vVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  HighsInt iToEl_1;
  HighsInt iRow_5;
  HighsInt iEl_3;
  HighsInt iToEl;
  HighsInt iRow_4;
  HighsInt iEl_2;
  HighsInt iCol_1;
  HighsInt iRow_3;
  HighsInt iRow_2;
  HighsInt iRow_1;
  HighsInt iEl_1;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  vector<int,_std::allocator<int>_> ar_end;
  vector<double,_std::allocator<double>_> *ar_value;
  vector<int,_std::allocator<int>_> *ar_index;
  vector<int,_std::allocator<int>_> *ar_p_end;
  vector<int,_std::allocator<int>_> *ar_start;
  vector<double,_std::allocator<double>_> *a_value;
  vector<int,_std::allocator<int>_> *a_index;
  vector<int,_std::allocator<int>_> *a_start;
  HighsInt num_nz;
  HighsInt num_row;
  HighsInt num_col;
  bool all_in_partition;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar7;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  value_type vVar8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar9;
  value_type in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int local_bc;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_9c;
  int local_94;
  int local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<double,_std::allocator<double>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *local_30;
  HighsInt local_28;
  int local_24;
  int local_20;
  byte local_19;
  long local_18;
  long local_10;
  
  local_19 = in_RDX == 0;
  local_20 = *(int *)(in_RSI + 4);
  local_24 = *(int *)(in_RSI + 8);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = numNz((HighsSparseMatrix *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_30 = (vector<int,_std::allocator<int>_> *)(local_10 + 0x10);
  local_38 = (vector<int,_std::allocator<int>_> *)(local_10 + 0x40);
  local_40 = (vector<double,_std::allocator<double>_> *)(local_10 + 0x58);
  local_48 = (vector<int,_std::allocator<int>_> *)(in_RDI + 4);
  local_50 = (vector<int,_std::allocator<int>_> *)(in_RDI + 10);
  local_58 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x10);
  local_60 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x16);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7ecba0);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,(value_type_conflict2 *)0x7ecbe3);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,(value_type_conflict2 *)0x7ecc0d);
  for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
    if (((local_19 & 1) == 0) && (*(char *)(local_18 + local_90) == '\0')) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_90);
      for (local_9c = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)(local_90 + 1))
          , local_9c < *pvVar3; local_9c = local_9c + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_9c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)*pvVar3);
        *pvVar4 = *pvVar4 + 1;
      }
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_90);
      for (local_94 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)(local_90 + 1))
          , local_94 < *pvVar3; local_94 = local_94 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_94);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)*pvVar3);
        *pvVar4 = *pvVar4 + 1;
      }
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_48,0);
  *pvVar4 = 0;
  for (local_a4 = 0; local_a4 < local_24; local_a4 = local_a4 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_a4);
    iVar9 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_a4);
    iVar7 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_a4);
    iVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)(local_a4 + 1));
    *pvVar4 = iVar9 + iVar7 + iVar1;
  }
  for (local_a8 = 0; local_a8 < local_24; local_a8 = local_a8 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_a8);
    in_stack_ffffffffffffff10 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_a8);
    in_stack_ffffffffffffff14 = in_stack_ffffffffffffff10 + *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_a8);
    *pvVar4 = in_stack_ffffffffffffff14;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_a8);
    vVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_a8);
    *pvVar4 = vVar2;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  for (local_ac = 0; local_ac < local_20; local_ac = local_ac + 1) {
    if (((local_19 & 1) == 0) && (*(char *)(local_18 + local_ac) == '\0')) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_ac);
      for (local_bc = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)(local_ac + 1))
          , local_bc < *pvVar3; local_bc = local_bc + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_bc);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)*pvVar3);
        iVar9 = *pvVar4;
        *pvVar4 = iVar9 + 1;
        iVar7 = local_ac;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_58,(long)iVar9);
        *pvVar4 = iVar7;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_bc);
        vVar8 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)iVar9);
        *pvVar6 = vVar8;
      }
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_ac);
      local_b0 = *pvVar3;
      while (iVar9 = local_b0,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_30,(long)(local_ac + 1)), iVar9 < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_b0);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)*pvVar3);
        iVar9 = *pvVar4;
        *pvVar4 = iVar9 + 1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_58,(long)iVar9);
        *pvVar4 = local_ac;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_b0);
        in_stack_ffffffffffffff00 = (vector<int,_std::allocator<int>_> *)*pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)iVar9);
        *pvVar6 = (value_type)in_stack_ffffffffffffff00;
        local_b0 = local_b0 + 1;
      }
    }
  }
  *in_RDI = 3;
  in_RDI[1] = local_20;
  in_RDI[2] = local_24;
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void HighsSparseMatrix::createRowwisePartitioned(
    const HighsSparseMatrix& matrix, const int8_t* in_partition) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  const bool all_in_partition = in_partition == NULL;

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& ar_start = this->start_;
  vector<HighsInt>& ar_p_end = this->p_end_;
  vector<HighsInt>& ar_index = this->index_;
  vector<double>& ar_value = this->value_;

  // Use ar_p_end and ar_end to compute lengths, which are then transformed into
  // the p_ends and ends of the inserted entries
  std::vector<HighsInt> ar_end;
  ar_start.resize(num_row + 1);
  ar_p_end.assign(num_row, 0);
  ar_end.assign(num_row, 0);
  // Count the nonzeros of nonbasic and basic columns in each row
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (all_in_partition || in_partition[iCol]) {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        ar_p_end[iRow]++;
      }
    } else {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        ar_end[iRow]++;
      }
    }
  }
  // Compute the starts and turn the lengths into ends
  ar_start[0] = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    ar_start[iRow + 1] = ar_start[iRow] + ar_p_end[iRow] + ar_end[iRow];
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    ar_end[iRow] = ar_start[iRow] + ar_p_end[iRow];
    ar_p_end[iRow] = ar_start[iRow];
  }
  // Insert the entries
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (all_in_partition || in_partition[iCol]) {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        HighsInt iToEl = ar_p_end[iRow]++;
        ar_index[iToEl] = iCol;
        ar_value[iToEl] = a_value[iEl];
      }
    } else {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        HighsInt iToEl = ar_end[iRow]++;
        ar_index[iToEl] = iCol;
        ar_value[iToEl] = a_value[iEl];
      }
    }
  }
  this->format_ = MatrixFormat::kRowwisePartitioned;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}